

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isubd-ccmesh.cpp
# Opt level: O1

bool loadSubdCsLodProgram(void)

{
  bool bVar1;
  GLenum GVar2;
  djg_program *djp;
  size_t sVar3;
  char buf [1024];
  char acStack_428 [8];
  char acStack_420 [8];
  undefined4 auStack_418 [254];
  
  if (g_geometry.method == 2) {
    djp = (djg_program *)malloc(0x10);
    djp->src = (char *)0x0;
    djp->next = (djg_program *)0x0;
    fwrite("Loading {Compute-LoD-Program}\n",0x1e,1,_stdout);
    fflush(_stdout);
    setupSubdKernel(djp);
    djgp_push_string(djp,"#define BUFFER_BINDING_CULLED_SUBD %i\n",9);
    djgp_push_string(djp,"#define BUFFER_BINDING_CULLED_SUBD_COUNTER %i\n",2);
    strcpy(acStack_428,g_app.dir.shader);
    sVar3 = strlen(acStack_428);
    builtin_strncpy(acStack_428 + sVar3,"terrain_",8);
    builtin_strncpy(acStack_420 + sVar3,"cs_lod.g",8);
    *(undefined4 *)((long)auStack_418 + sVar3) = 0x6c736c;
    djgp_push_file(djp,acStack_428);
    bVar1 = djgp_to_gl(djp,0x1c2,false,true,g_gl.programs + 1);
    if (!bVar1) {
      fwrite("=> Failure <=\n",0xe,1,_stdout);
      fflush(_stdout);
      djgp_release(djp);
      return false;
    }
    djgp_release(djp);
    g_gl.uniforms[5] = (*glad_glGetUniformLocation)(g_gl.programs[1],"u_DmapFactor");
    g_gl.uniforms[4] = (*glad_glGetUniformLocation)(g_gl.programs[1],"u_DmapSampler");
    g_gl.uniforms[6] = (*glad_glGetUniformLocation)(g_gl.programs[1],"u_LodFactor");
    configureSubdCsLodProgram();
  }
  GVar2 = (*glad_glGetError)();
  return GVar2 == 0;
}

Assistant:

bool loadSubdCsLodProgram()
{
    if (g_geometry.method == METHOD_CS) {
        djg_program *djp = djgp_create();
        GLuint *program = &g_gl.programs[PROGRAM_SUBD_CS_LOD];
        char buf[1024];

        LOG("Loading {Compute-LoD-Program}\n");
        setupSubdKernel(djp);

        djgp_push_string(djp,
                         "#define BUFFER_BINDING_CULLED_SUBD %i\n",
                         BUFFER_CULLED_SUBD2);
        djgp_push_string(djp,
                         "#define BUFFER_BINDING_CULLED_SUBD_COUNTER %i\n",
                         STREAM_CULLED_SUBD_COUNTER);
        djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "terrain_cs_lod.glsl"));

        if (!djgp_to_gl(djp, 450, false, true, program)) {
            LOG("=> Failure <=\n");
            djgp_release(djp);

            return false;
        }
        djgp_release(djp);

        g_gl.uniforms[UNIFORM_SUBD_CS_LOD_DMAP_FACTOR] =
            glGetUniformLocation(g_gl.programs[PROGRAM_SUBD_CS_LOD], "u_DmapFactor");
        g_gl.uniforms[UNIFORM_SUBD_CS_LOD_DMAP_SAMPLER] =
            glGetUniformLocation(g_gl.programs[PROGRAM_SUBD_CS_LOD], "u_DmapSampler");
        g_gl.uniforms[UNIFORM_SUBD_CS_LOD_LOD_FACTOR] =
            glGetUniformLocation(g_gl.programs[PROGRAM_SUBD_CS_LOD], "u_LodFactor");

        configureSubdCsLodProgram();
    }

    return (glGetError() == GL_NO_ERROR);
}